

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  ushort uVar1;
  ushort uVar2;
  ObjectValues *pOVar3;
  ObjectValues *pOVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar10;
  uint *__s;
  uint *__s_00;
  bool bVar11;
  string local_48;
  size_t sVar9;
  
  uVar1 = *(ushort *)&this->field_0x8;
  uVar2 = *(ushort *)&other->field_0x8;
  uVar10 = uVar2 & 0xff;
  bVar11 = (uVar1 & 0xff) < uVar10;
  if ((uVar1 & 0xff) == uVar10) {
    switch((char)uVar1) {
    case '\0':
      bVar11 = false;
      break;
    case '\x01':
      bVar11 = (this->value_).int_ < (other->value_).int_;
      break;
    case '\x02':
      bVar11 = (this->value_).uint_ < (other->value_).uint_;
      break;
    case '\x03':
      bVar11 = (this->value_).real_ <= (other->value_).real_ &&
               (other->value_).real_ != (this->value_).real_;
      break;
    case '\x04':
      __s = (uint *)(this->value_).string_;
      __s_00 = (uint *)(other->value_).string_;
      if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
        bVar11 = __s_00 != (uint *)0x0;
      }
      else {
        if ((uVar1 >> 8 & 1) == 0) {
          sVar9 = strlen((char *)__s);
          uVar7 = (uint)sVar9;
        }
        else {
          uVar7 = *__s;
          __s = __s + 1;
        }
        if ((uVar2 >> 8 & 1) == 0) {
          sVar9 = strlen((char *)__s_00);
          uVar8 = (uint)sVar9;
        }
        else {
          uVar8 = *__s_00;
          __s_00 = __s_00 + 1;
        }
        if ((__s == (uint *)0x0) || (__s_00 == (uint *)0x0)) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"assert json failed","");
          throwLogicError(&local_48);
        }
        uVar5 = uVar7;
        if (uVar8 < uVar7) {
          uVar5 = uVar8;
        }
        iVar6 = memcmp(__s,__s_00,(ulong)uVar5);
        bVar11 = true;
        if (-1 < iVar6) {
          bVar11 = uVar7 < uVar8 && iVar6 == 0;
        }
      }
      break;
    case '\x05':
      bVar11 = (this->value_).bool_ < (other->value_).bool_;
      break;
    case '\x06':
    case '\a':
      pOVar3 = (this->value_).map_;
      pOVar4 = (other->value_).map_;
      iVar6 = (int)(pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count -
              (int)(pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      if (iVar6 == 0) {
        bVar11 = std::
                 __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,__gnu_cxx::__ops::_Iter_less_iter>
                           ((pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            &(pOVar3->_M_t)._M_impl.super__Rb_tree_header,
                            (pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            &(pOVar4->_M_t)._M_impl.super__Rb_tree_header);
        return bVar11;
      }
      bVar11 = SUB41((uint)iVar6 >> 0x1f,0);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/IcicleF[P]ai9_logic_2018/src/jsoncpp.cpp"
                    ,0xbdc,"bool Json::Value::operator<(const Value &) const");
    }
  }
  return bVar11;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      if (other.value_.string_) return true;
      else return false;
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    unsigned min_len = std::min(this_len, other_len);
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, min_len);
    if (comp < 0) return true;
    if (comp > 0) return false;
    return (this_len < other_len);
  }
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}